

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

void assert_table(rtr_socket *socket,aspa_record *records,size_t record_count)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  long lVar3;
  aspa_store_node *paVar4;
  aspa_array *paVar5;
  aspa_record *paVar6;
  ulong uVar7;
  aspa_store_node **ppaVar8;
  size_t sVar9;
  size_t sVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (socket->aspa_table == (aspa_table *)0x0) {
    __assert_fail("socket->aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x106,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
  }
  ppaVar8 = &socket->aspa_table->store;
  if (record_count == 0) {
    while (paVar4 = *ppaVar8, paVar4 != (aspa_store_node *)0x0) {
      if (paVar4->rtr_socket == socket) {
        if (paVar4->aspa_array == (aspa_array *)0x0) {
          __assert_fail("node->aspa_array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10e,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        if (paVar4->aspa_array->size != 0) {
          __assert_fail("node->aspa_array->size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x10f,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
        break;
      }
      ppaVar8 = &paVar4->next;
    }
  }
  else {
    paVar4 = *ppaVar8;
    if (paVar4 == (aspa_store_node *)0x0) {
      __assert_fail("socket->aspa_table->store",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    paVar5 = paVar4->aspa_array;
    if (paVar5 == (aspa_array *)0x0) {
      __assert_fail("socket->aspa_table->store->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11b,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar4->rtr_socket == (rtr_socket *)0x0) {
      __assert_fail("socket->aspa_table->store->rtr_socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11c,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar4->rtr_socket != socket) {
      __assert_fail("socket->aspa_table->store->rtr_socket == socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11d,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (paVar4->next != (aspa_store_node *)0x0) {
      __assert_fail("!socket->aspa_table->store->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x11e,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    uVar7 = (ulong)paVar5->size;
    if (uVar7 != record_count) {
      printf("error: unexpected number of stored records!");
      uVar7 = (ulong)paVar5->size;
    }
    if (uVar7 != record_count) {
      __assert_fail("array->size == record_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x125,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    if (records == (aspa_record *)0x0) {
      __assert_fail("records",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0x12a,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    paVar6 = paVar5->data;
    if (paVar6 == (aspa_record *)0x0) {
      __assert_fail("array->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,299,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
    }
    for (sVar9 = 0; sVar9 != record_count; sVar9 = sVar9 + 1) {
      if (paVar6[sVar9].customer_asn != records[sVar9].customer_asn) {
        __assert_fail("array->data[i].customer_asn == records[i].customer_asn",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x12e,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)")
        ;
      }
      if (paVar6[sVar9].provider_count != records[sVar9].provider_count) {
        __assert_fail("array->data[i].provider_count == records[i].provider_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x12f,"void assert_table(struct rtr_socket *, struct aspa_record *, size_t)")
        ;
      }
      sVar10 = 0;
      while (paVar6[sVar9].provider_count != sVar10) {
        puVar1 = paVar6[sVar9].provider_asns + sVar10;
        puVar2 = records[sVar9].provider_asns + sVar10;
        sVar10 = sVar10 + 1;
        if (*puVar1 != *puVar2) {
          __assert_fail("array->data[i].provider_asns[k] == records[i].provider_asns[k]",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                        ,0x132,
                        "void assert_table(struct rtr_socket *, struct aspa_record *, size_t)");
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_table(struct rtr_socket *socket, struct aspa_record records[], size_t record_count)
{
	assert(socket);
	assert(socket->aspa_table);

	if (record_count == 0) {
		// Assert no data exists for that socket!
		struct aspa_store_node *node = socket->aspa_table->store;

		while (node) {
			if (node->rtr_socket == socket) {
				assert(node->aspa_array);
				assert(node->aspa_array->size == 0);
				return;
			}

			node = node->next;
		}

		return;
	}

	// Assert data exists for that socket...
	assert(socket->aspa_table->store);
	assert(socket->aspa_table->store->aspa_array);
	assert(socket->aspa_table->store->rtr_socket);
	assert(socket->aspa_table->store->rtr_socket == socket);
	assert(!socket->aspa_table->store->next);

	struct aspa_array *array = socket->aspa_table->store->aspa_array;

	if (array->size != record_count)
		printf("error: unexpected number of stored records!");

	assert(array->size == record_count);

	if (record_count <= 0)
		return;

	assert(records);
	assert(array->data);

	for (size_t i = 0; i < record_count; i++) {
		assert(array->data[i].customer_asn == records[i].customer_asn);
		assert(array->data[i].provider_count == records[i].provider_count);

		for (size_t k = 0; k < records[i].provider_count; k++)
			assert(array->data[i].provider_asns[k] == records[i].provider_asns[k]);
	}
}